

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

Population * __thiscall
Population::tournament_selection(Population *__return_storage_ptr__,Population *this,int generation)

{
  int iVar1;
  size_type sVar2;
  iterator iVar3;
  iterator __last;
  difference_type dVar4;
  vector<Chromosome,_std::allocator<Chromosome>_> *this_00;
  double dVar5;
  double dVar6;
  Chromosome *local_148;
  vector<Chromosome,_std::allocator<Chromosome>_> local_108;
  undefined1 local_f0 [8];
  Chromosome winner;
  Chromosome *ch2;
  Chromosome *ch1;
  iterator rI2;
  iterator rI1;
  iterator current;
  long left;
  undefined1 local_38 [4];
  int t_rounds;
  vector<Chromosome,_std::allocator<Chromosome>_> new_chromosomes;
  int generation_local;
  Population *this_local;
  
  new_chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = generation;
  std::vector<Chromosome,_std::allocator<Chromosome>_>::vector
            ((vector<Chromosome,_std::allocator<Chromosome>_> *)local_38);
  this_00 = &this->chromosomes;
  sVar2 = std::vector<Chromosome,_std::allocator<Chromosome>_>::size(this_00);
  left._4_4_ = (int)sVar2;
  iVar3 = std::vector<Chromosome,_std::allocator<Chromosome>_>::begin(this_00);
  __last = std::vector<Chromosome,_std::allocator<Chromosome>_>::end(this_00);
  dVar4 = std::
          distance<__gnu_cxx::__normal_iterator<Chromosome*,std::vector<Chromosome,std::allocator<Chromosome>>>>
                    ((__normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>
                      )iVar3._M_current,
                     (__normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>
                      )__last._M_current);
  iVar3 = std::vector<Chromosome,_std::allocator<Chromosome>_>::begin(&this->chromosomes);
  while (left._4_4_ != 0) {
    ch1 = iVar3._M_current;
    rI2._M_current = iVar3._M_current;
    iVar1 = rand();
    std::
    advance<__gnu_cxx::__normal_iterator<Chromosome*,std::vector<Chromosome,std::allocator<Chromosome>>>,long>
              (&rI2,(long)iVar1 % dVar4);
    iVar1 = rand();
    std::
    advance<__gnu_cxx::__normal_iterator<Chromosome*,std::vector<Chromosome,std::allocator<Chromosome>>>,long>
              ((__normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>
                *)&ch1,(long)iVar1 % dVar4);
    local_148 = __gnu_cxx::
                __normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>
                ::operator*(&rI2);
    winner.pathList.super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>
                  ::operator*((__normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>
                               *)&ch1);
    dVar5 = Chromosome::getFitness(local_148);
    dVar6 = Chromosome::getFitness
                      ((Chromosome *)
                       winner.pathList.super__Vector_base<Coordinate,_std::allocator<Coordinate>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (dVar5 <= dVar6) {
      local_148 = (Chromosome *)
                  winner.pathList.super__Vector_base<Coordinate,_std::allocator<Coordinate>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    Chromosome::Chromosome((Chromosome *)local_f0,local_148);
    std::vector<Chromosome,_std::allocator<Chromosome>_>::push_back
              ((vector<Chromosome,_std::allocator<Chromosome>_> *)local_38,(value_type *)local_f0);
    left._4_4_ = left._4_4_ + -1;
    Chromosome::~Chromosome((Chromosome *)local_f0);
  }
  std::vector<Chromosome,_std::allocator<Chromosome>_>::vector
            (&local_108,(vector<Chromosome,_std::allocator<Chromosome>_> *)local_38);
  Population(__return_storage_ptr__,&local_108);
  std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&local_108);
  std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector
            ((vector<Chromosome,_std::allocator<Chromosome>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Population Population::tournament_selection(int generation) {

    std::vector<Chromosome> new_chromosomes;


    //Fisher-Yates shuffle
    int t_rounds = (int) chromosomes.size();
    //std::cout << crossover_count << std::endl;

    long left = std::distance(chromosomes.begin(), chromosomes.end());
    auto current = chromosomes.begin();

    while (t_rounds) {
        auto rI1 = current;
        auto rI2 = current;
        std::advance(rI1, rand() % left);
        std::advance(rI2, rand() % left);
        //std::swap(*current, *r);
        Chromosome &ch1 = (*(rI1));
        Chromosome &ch2 = (*(rI2));

        Chromosome winner = (ch1.getFitness() > ch2.getFitness()) ? ch1 : ch2;
        new_chromosomes.push_back(std::move(winner));

        --t_rounds;
    }

/*
    static const float t = 0.6f;
    std::uniform_int_distribution<int> uniform_dist(0, chromosomes.size());

    for (size_t i = 0; i < chromosomes.size(); ++i) {
        Chromosome* c1 = nullptr;
        while (!c1){
            int index = uniform_dist(randomEngine) - 1;

            Chromosome& c = chromosomes[index];
            if (&c != c1) {
                c1 = &c;
            }
        }

        Chromosome* c2 = nullptr;
        while (!c2) {
            int index = uniform_dist(randomEngine) - 1;
            Chromosome& c = chromosomes[index];
            if (&c != c2) {
                c2 = &c;
            }
        }



        float r = static_cast <float> (rand()) / static_cast <float> (RAND_MAX);
        if (r >= t) {
            winner = *c2;
        }

        new_chromosomes.push_back(std::move(winner));

    }
*/
    return Population(new_chromosomes);

 }